

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  int iVar1;
  ImFontConfig *cfg;
  ImFontConfig *pIVar2;
  long lVar3;
  int height;
  
  pIVar2 = (atlas->ConfigData).Data;
  for (lVar3 = (long)(atlas->ConfigData).Size * 0x90; lVar3 != 0; lVar3 = lVar3 + -0x90) {
    pIVar2->SizePixels = (float)(int)pIVar2->SizePixels;
    pIVar2 = pIVar2 + 1;
  }
  if (atlas->PackIdMouseCursors < 0) {
    if ((atlas->Flags & 2) == 0) {
      height = 0x1b;
      iVar1 = 0xf5;
    }
    else {
      height = 2;
      iVar1 = height;
    }
    iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,iVar1,height);
    atlas->PackIdMouseCursors = iVar1;
  }
  if ((atlas->PackIdLines < 0) && ((atlas->Flags & 4) == 0)) {
    iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x41,0x40);
    atlas->PackIdLines = iVar1;
  }
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    // Round font size
    // - We started rounding in 1.90 WIP (18991) as our layout system currently doesn't support non-rounded font size well yet.
    // - Note that using io.FontGlobalScale or SetWindowFontScale(), with are legacy-ish, partially supported features, can still lead to unrounded sizes.
    // - We may support it better later and remove this rounding.
    for (ImFontConfig& cfg : atlas->ConfigData)
       cfg.SizePixels = ImTrunc(cfg.SizePixels);

    // Register texture region for mouse cursors or standard white pixels
    if (atlas->PackIdMouseCursors < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
        else
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(2, 2);
    }

    // Register texture region for thick lines
    // The +2 here is to give space for the end caps, whilst height +1 is to accommodate the fact we have a zero-width row
    if (atlas->PackIdLines < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoBakedLines))
            atlas->PackIdLines = atlas->AddCustomRectRegular(IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 2, IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1);
    }
}